

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::CBlockIndexWorkComparator::operator()
          (CBlockIndexWorkComparator *this,CBlockIndex *pa,CBlockIndex *pb)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = operator>(&(pa->nChainWork).super_base_uint<256U>,&(pb->nChainWork).super_base_uint<256U>)
  ;
  if (!bVar2) {
    bVar2 = ::operator<(&(pa->nChainWork).super_base_uint<256U>,
                        &(pb->nChainWork).super_base_uint<256U>);
    bVar3 = true;
    if (bVar2) goto LAB_0075afcd;
    if (pb->nSequenceId <= pa->nSequenceId) {
      bVar3 = pb < pa || pb->nSequenceId < pa->nSequenceId;
      goto LAB_0075afcd;
    }
  }
  bVar3 = false;
LAB_0075afcd:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CBlockIndexWorkComparator::operator()(const CBlockIndex* pa, const CBlockIndex* pb) const
{
    // First sort by most total work, ...
    if (pa->nChainWork > pb->nChainWork) return false;
    if (pa->nChainWork < pb->nChainWork) return true;

    // ... then by earliest time received, ...
    if (pa->nSequenceId < pb->nSequenceId) return false;
    if (pa->nSequenceId > pb->nSequenceId) return true;

    // Use pointer address as tie breaker (should only happen with blocks
    // loaded from disk, as those all have id 0).
    if (pa < pb) return false;
    if (pa > pb) return true;

    // Identical blocks.
    return false;
}